

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

int ncnn::binary_op_broadcast_inner(Mat *a,Mat *b,Mat *c,int op_type,Option *opt)

{
  int in_ECX;
  undefined8 *in_RSI;
  Mat b2;
  undefined4 in_stack_00000330;
  Allocator *in_stack_fffffffffffff9f8;
  Mat *pMVar1;
  int in_stack_fffffffffffffa00;
  int in_stack_fffffffffffffa04;
  Mat *in_stack_fffffffffffffa08;
  Allocator *in_stack_fffffffffffffa70;
  undefined8 in_stack_fffffffffffffa78;
  Mat *pMVar2;
  Mat local_568;
  Mat local_520;
  Mat local_4d8;
  Mat local_490;
  Mat local_448;
  Mat local_3f0;
  Mat local_3a8;
  int local_354;
  int local_334;
  Mat *local_330;
  Mat *local_320;
  Mat *local_310;
  Mat *local_300;
  Mat *local_2f0;
  Mat *local_2e0;
  Mat *local_2d0;
  int local_2b0;
  undefined4 local_2ac;
  Mat *local_2a8;
  int local_290;
  undefined4 local_28c;
  Mat *local_288;
  int local_270;
  undefined4 local_26c;
  Mat *local_268;
  int local_250;
  undefined4 local_24c;
  Mat *local_248;
  int local_230;
  undefined4 local_22c;
  Mat *local_228;
  int local_210;
  undefined4 local_20c;
  Mat *local_208;
  int local_1f0;
  undefined4 local_1ec;
  Mat *local_1e8;
  void *local_180;
  Mat *local_168;
  int local_160;
  undefined4 local_15c;
  Mat *local_158;
  Mat *local_150;
  Mat *local_148;
  int local_140;
  undefined4 local_13c;
  Mat *local_138;
  void *local_130;
  int local_128;
  undefined4 local_124;
  Mat *local_120;
  Mat *local_118;
  Mat *local_110;
  int local_108;
  undefined4 local_104;
  Mat *local_100;
  void *local_f8;
  int local_f0;
  undefined4 local_ec;
  Mat *local_e8;
  Mat *local_e0;
  Mat *local_d8;
  int local_d0;
  undefined4 local_cc;
  Mat *local_c8;
  void *local_c0;
  int local_b8;
  undefined4 local_b4;
  Mat *local_b0;
  Mat *local_a8;
  Mat *local_a0;
  int local_98;
  undefined4 local_94;
  Mat *local_90;
  void *local_88;
  int local_80;
  undefined4 local_7c;
  Mat *local_78;
  Mat *local_70;
  Mat *local_68;
  int local_60;
  undefined4 local_5c;
  Mat *local_58;
  void *local_50;
  int local_48;
  undefined4 local_44;
  Mat *local_40;
  Mat *local_38;
  Mat *local_30;
  int local_28;
  undefined4 local_24;
  Mat *local_20;
  void *local_18;
  int local_10;
  undefined4 local_c;
  Mat *local_8;
  
  local_168 = &local_3a8;
  local_3a8.data = (void *)*in_RSI;
  local_3a8.refcount = (int *)in_RSI[1];
  local_3a8.elemsize = in_RSI[2];
  local_3a8.elempack = *(int *)(in_RSI + 3);
  local_3a8.allocator = (Allocator *)in_RSI[4];
  local_3a8.dims = *(int *)(in_RSI + 5);
  local_3a8.w = *(int *)((long)in_RSI + 0x2c);
  local_3a8.h = *(int *)(in_RSI + 6);
  local_3a8.d = *(int *)((long)in_RSI + 0x34);
  local_3a8.c = *(int *)(in_RSI + 7);
  local_3a8.cstep = in_RSI[8];
  if (local_3a8.refcount != (int *)0x0) {
    local_c = 1;
    LOCK();
    local_10 = *local_3a8.refcount;
    *local_3a8.refcount = *local_3a8.refcount + 1;
    UNLOCK();
  }
  local_354 = in_ECX;
  local_8 = local_168;
  if ((*(int *)(in_RSI + 5) == 2) && (*(int *)((long)in_RSI + 0x2c) == 1)) {
    Mat::reshape(in_stack_fffffffffffffa08,in_stack_fffffffffffffa04,in_stack_fffffffffffff9f8);
    pMVar1 = &local_3a8;
    local_40 = &local_3f0;
    local_38 = pMVar1;
    if (pMVar1 != local_40) {
      if (local_3f0.refcount != (int *)0x0) {
        local_44 = 1;
        LOCK();
        local_48 = *local_3f0.refcount;
        *local_3f0.refcount = *local_3f0.refcount + 1;
        UNLOCK();
      }
      pMVar2 = pMVar1;
      local_20 = pMVar1;
      if (local_3a8.refcount != (int *)0x0) {
        local_24 = 0xffffffff;
        LOCK();
        local_28 = *local_3a8.refcount;
        *local_3a8.refcount = *local_3a8.refcount + -1;
        UNLOCK();
        if (local_28 == 1) {
          if (local_3a8.allocator == (Allocator *)0x0) {
            local_18 = local_3a8.data;
            if (local_3a8.data != (void *)0x0) {
              free(local_3a8.data);
            }
          }
          else {
            (*(local_3a8.allocator)->_vptr_Allocator[3])(local_3a8.allocator,local_3a8.data);
          }
        }
      }
      pMVar1->data = (void *)0x0;
      pMVar1->elemsize = 0;
      pMVar1->elempack = 0;
      pMVar1->dims = 0;
      pMVar1->w = 0;
      pMVar1->h = 0;
      pMVar1->d = 0;
      pMVar1->c = 0;
      pMVar1->cstep = 0;
      pMVar1->refcount = (int *)0x0;
      pMVar2->data = local_40->data;
      pMVar2->refcount = local_40->refcount;
      pMVar2->elemsize = local_40->elemsize;
      pMVar2->elempack = local_40->elempack;
      pMVar2->allocator = local_40->allocator;
      pMVar2->dims = local_40->dims;
      pMVar2->w = local_40->w;
      pMVar2->h = local_40->h;
      pMVar2->d = local_40->d;
      pMVar2->c = local_40->c;
      pMVar2->cstep = local_40->cstep;
      pMVar1 = pMVar2;
    }
    local_330 = &local_3f0;
    local_1e8 = local_330;
    local_30 = pMVar1;
    if (local_3f0.refcount != (int *)0x0) {
      local_1ec = 0xffffffff;
      LOCK();
      local_1f0 = *local_3f0.refcount;
      *local_3f0.refcount = *local_3f0.refcount + -1;
      UNLOCK();
      if (local_1f0 == 1) {
        if (local_3f0.allocator == (Allocator *)0x0) {
          if (local_3f0.data != (void *)0x0) {
            free(local_3f0.data);
          }
        }
        else {
          (*(local_3f0.allocator)->_vptr_Allocator[3])(local_3f0.allocator,local_3f0.data);
        }
      }
    }
    local_3f0.data = (void *)0x0;
    local_3f0.elemsize = 0;
    local_3f0.elempack = 0;
    local_3f0.dims = 0;
    local_3f0.w = 0;
    local_3f0.h = 0;
    local_3f0.d = 0;
    local_3f0.c = 0;
    local_3f0.cstep = 0;
    local_3f0.refcount = (int *)0x0;
  }
  else if ((*(int *)(in_RSI + 5) == 3) && (*(int *)(in_RSI + 6) == 1)) {
    Mat::reshape(in_stack_fffffffffffffa08,in_stack_fffffffffffffa04,in_stack_fffffffffffff9f8);
    local_78 = &local_448;
    local_70 = &local_3a8;
    if (&local_3a8 != local_78) {
      if (local_448.refcount != (int *)0x0) {
        local_7c = 1;
        LOCK();
        local_80 = *local_448.refcount;
        *local_448.refcount = *local_448.refcount + 1;
        UNLOCK();
      }
      local_58 = &local_3a8;
      if (local_3a8.refcount != (int *)0x0) {
        local_5c = 0xffffffff;
        LOCK();
        local_60 = *local_3a8.refcount;
        *local_3a8.refcount = *local_3a8.refcount + -1;
        UNLOCK();
        if (local_60 == 1) {
          if (local_3a8.allocator == (Allocator *)0x0) {
            local_50 = local_3a8.data;
            if (local_3a8.data != (void *)0x0) {
              free(local_3a8.data);
            }
          }
          else {
            (*(local_3a8.allocator)->_vptr_Allocator[3])(local_3a8.allocator,local_3a8.data);
          }
        }
      }
      local_3a8.data = (void *)0x0;
      local_3a8.elemsize = 0;
      local_3a8.elempack = 0;
      local_3a8.dims = 0;
      local_3a8.w = 0;
      local_3a8.h = 0;
      local_3a8.d = 0;
      local_3a8.c = 0;
      local_3a8.cstep = 0;
      local_3a8.refcount = (int *)0x0;
      local_3a8.data = local_78->data;
      local_3a8.refcount = local_78->refcount;
      local_3a8.elemsize = local_78->elemsize;
      local_3a8.elempack = local_78->elempack;
      local_3a8.allocator = local_78->allocator;
      local_3a8.dims = local_78->dims;
      local_3a8.w = local_78->w;
      local_3a8.h = local_78->h;
      local_3a8.d = local_78->d;
      local_3a8.c = local_78->c;
      local_3a8.cstep = local_78->cstep;
    }
    local_320 = &local_448;
    local_208 = local_320;
    local_68 = &local_3a8;
    if (local_448.refcount != (int *)0x0) {
      local_20c = 0xffffffff;
      LOCK();
      local_210 = *local_448.refcount;
      *local_448.refcount = *local_448.refcount + -1;
      UNLOCK();
      if (local_210 == 1) {
        if (local_448.allocator == (Allocator *)0x0) {
          if (local_448.data != (void *)0x0) {
            free(local_448.data);
          }
        }
        else {
          (*(local_448.allocator)->_vptr_Allocator[3])(local_448.allocator,local_448.data);
        }
      }
    }
    local_448.data = (void *)0x0;
    local_448.elemsize = 0;
    local_448.elempack = 0;
    local_448.dims = 0;
    local_448.w = 0;
    local_448.h = 0;
    local_448.d = 0;
    local_448.c = 0;
    local_448.cstep = 0;
    local_448.refcount = (int *)0x0;
  }
  else if ((*(int *)(in_RSI + 5) == 3) && (*(int *)((long)in_RSI + 0x2c) == 1)) {
    Mat::reshape(in_stack_fffffffffffffa08,in_stack_fffffffffffffa04,in_stack_fffffffffffffa00,
                 in_stack_fffffffffffff9f8);
    local_b0 = &local_490;
    local_a8 = &local_3a8;
    if (&local_3a8 != local_b0) {
      if (local_490.refcount != (int *)0x0) {
        local_b4 = 1;
        LOCK();
        local_b8 = *local_490.refcount;
        *local_490.refcount = *local_490.refcount + 1;
        UNLOCK();
      }
      local_90 = &local_3a8;
      if (local_3a8.refcount != (int *)0x0) {
        local_94 = 0xffffffff;
        LOCK();
        local_98 = *local_3a8.refcount;
        *local_3a8.refcount = *local_3a8.refcount + -1;
        UNLOCK();
        if (local_98 == 1) {
          if (local_3a8.allocator == (Allocator *)0x0) {
            local_88 = local_3a8.data;
            if (local_3a8.data != (void *)0x0) {
              free(local_3a8.data);
            }
          }
          else {
            (*(local_3a8.allocator)->_vptr_Allocator[3])(local_3a8.allocator,local_3a8.data);
          }
        }
      }
      local_3a8.data = (void *)0x0;
      local_3a8.elemsize = 0;
      local_3a8.elempack = 0;
      local_3a8.dims = 0;
      local_3a8.w = 0;
      local_3a8.h = 0;
      local_3a8.d = 0;
      local_3a8.c = 0;
      local_3a8.cstep = 0;
      local_3a8.refcount = (int *)0x0;
      local_3a8.data = local_b0->data;
      local_3a8.refcount = local_b0->refcount;
      local_3a8.elemsize = local_b0->elemsize;
      local_3a8.elempack = local_b0->elempack;
      local_3a8.allocator = local_b0->allocator;
      local_3a8.dims = local_b0->dims;
      local_3a8.w = local_b0->w;
      local_3a8.h = local_b0->h;
      local_3a8.d = local_b0->d;
      local_3a8.c = local_b0->c;
      local_3a8.cstep = local_b0->cstep;
    }
    local_310 = &local_490;
    local_228 = local_310;
    local_a0 = &local_3a8;
    if (local_490.refcount != (int *)0x0) {
      local_22c = 0xffffffff;
      LOCK();
      local_230 = *local_490.refcount;
      *local_490.refcount = *local_490.refcount + -1;
      UNLOCK();
      if (local_230 == 1) {
        if (local_490.allocator == (Allocator *)0x0) {
          if (local_490.data != (void *)0x0) {
            free(local_490.data);
          }
        }
        else {
          (*(local_490.allocator)->_vptr_Allocator[3])(local_490.allocator,local_490.data);
        }
      }
    }
    local_490.data = (void *)0x0;
    local_490.elemsize = 0;
    local_490.elempack = 0;
    local_490.dims = 0;
    local_490.w = 0;
    local_490.h = 0;
    local_490.d = 0;
    local_490.c = 0;
    local_490.cstep = 0;
    local_490.refcount = (int *)0x0;
  }
  else if ((*(int *)(in_RSI + 5) == 4) && (*(int *)((long)in_RSI + 0x34) == 1)) {
    Mat::reshape(in_stack_fffffffffffffa08,in_stack_fffffffffffffa04,in_stack_fffffffffffff9f8);
    local_e8 = &local_4d8;
    local_e0 = &local_3a8;
    if (&local_3a8 != local_e8) {
      if (local_4d8.refcount != (int *)0x0) {
        local_ec = 1;
        LOCK();
        local_f0 = *local_4d8.refcount;
        *local_4d8.refcount = *local_4d8.refcount + 1;
        UNLOCK();
      }
      local_c8 = &local_3a8;
      if (local_3a8.refcount != (int *)0x0) {
        local_cc = 0xffffffff;
        LOCK();
        local_d0 = *local_3a8.refcount;
        *local_3a8.refcount = *local_3a8.refcount + -1;
        UNLOCK();
        if (local_d0 == 1) {
          if (local_3a8.allocator == (Allocator *)0x0) {
            local_c0 = local_3a8.data;
            if (local_3a8.data != (void *)0x0) {
              free(local_3a8.data);
            }
          }
          else {
            (*(local_3a8.allocator)->_vptr_Allocator[3])(local_3a8.allocator,local_3a8.data);
          }
        }
      }
      local_3a8.data = (void *)0x0;
      local_3a8.elemsize = 0;
      local_3a8.elempack = 0;
      local_3a8.dims = 0;
      local_3a8.w = 0;
      local_3a8.h = 0;
      local_3a8.d = 0;
      local_3a8.c = 0;
      local_3a8.cstep = 0;
      local_3a8.refcount = (int *)0x0;
      local_3a8.data = local_e8->data;
      local_3a8.refcount = local_e8->refcount;
      local_3a8.elemsize = local_e8->elemsize;
      local_3a8.elempack = local_e8->elempack;
      local_3a8.allocator = local_e8->allocator;
      local_3a8.dims = local_e8->dims;
      local_3a8.w = local_e8->w;
      local_3a8.h = local_e8->h;
      local_3a8.d = local_e8->d;
      local_3a8.c = local_e8->c;
      local_3a8.cstep = local_e8->cstep;
    }
    pMVar1 = &local_4d8;
    local_300 = pMVar1;
    local_248 = pMVar1;
    local_d8 = &local_3a8;
    if (local_4d8.refcount != (int *)0x0) {
      local_24c = 0xffffffff;
      LOCK();
      local_250 = *local_4d8.refcount;
      *local_4d8.refcount = *local_4d8.refcount + -1;
      UNLOCK();
      if (local_250 == 1) {
        if (local_4d8.allocator == (Allocator *)0x0) {
          if (local_4d8.data != (void *)0x0) {
            free(local_4d8.data);
          }
        }
        else {
          (*(local_4d8.allocator)->_vptr_Allocator[3])(local_4d8.allocator,local_4d8.data);
        }
      }
    }
    pMVar1->data = (void *)0x0;
    pMVar1->elemsize = 0;
    pMVar1->elempack = 0;
    pMVar1->dims = 0;
    pMVar1->w = 0;
    pMVar1->h = 0;
    pMVar1->d = 0;
    pMVar1->c = 0;
    pMVar1->cstep = 0;
    pMVar1->refcount = (int *)0x0;
  }
  else if ((*(int *)(in_RSI + 5) == 4) && (*(int *)(in_RSI + 6) == 1)) {
    Mat::reshape(in_stack_fffffffffffffa08,in_stack_fffffffffffffa04,in_stack_fffffffffffffa00,
                 in_stack_fffffffffffff9f8);
    pMVar1 = &local_3a8;
    local_120 = &local_520;
    local_118 = pMVar1;
    if (pMVar1 != local_120) {
      if (local_520.refcount != (int *)0x0) {
        local_124 = 1;
        LOCK();
        local_128 = *local_520.refcount;
        *local_520.refcount = *local_520.refcount + 1;
        UNLOCK();
      }
      local_100 = pMVar1;
      if (local_3a8.refcount != (int *)0x0) {
        local_104 = 0xffffffff;
        LOCK();
        local_108 = *local_3a8.refcount;
        *local_3a8.refcount = *local_3a8.refcount + -1;
        UNLOCK();
        if (local_108 == 1) {
          if (local_3a8.allocator == (Allocator *)0x0) {
            local_f8 = local_3a8.data;
            if (local_3a8.data != (void *)0x0) {
              free(local_3a8.data);
            }
          }
          else {
            (*(local_3a8.allocator)->_vptr_Allocator[3])(local_3a8.allocator,local_3a8.data);
          }
        }
      }
      local_3a8.data = (void *)0x0;
      local_3a8.elemsize = 0;
      local_3a8.elempack = 0;
      local_3a8.dims = 0;
      local_3a8.w = 0;
      local_3a8.h = 0;
      local_3a8.d = 0;
      local_3a8.c = 0;
      local_3a8.cstep = 0;
      local_3a8.refcount = (int *)0x0;
      pMVar1->data = local_120->data;
      pMVar1->refcount = local_120->refcount;
      pMVar1->elemsize = local_120->elemsize;
      pMVar1->elempack = local_120->elempack;
      pMVar1->allocator = local_120->allocator;
      pMVar1->dims = local_120->dims;
      pMVar1->w = local_120->w;
      pMVar1->h = local_120->h;
      pMVar1->d = local_120->d;
      pMVar1->c = local_120->c;
      pMVar1->cstep = local_120->cstep;
    }
    local_2f0 = &local_520;
    local_268 = local_2f0;
    local_110 = pMVar1;
    if (local_520.refcount != (int *)0x0) {
      local_26c = 0xffffffff;
      LOCK();
      local_270 = *local_520.refcount;
      *local_520.refcount = *local_520.refcount + -1;
      UNLOCK();
      if (local_270 == 1) {
        if (local_520.allocator == (Allocator *)0x0) {
          if (local_520.data != (void *)0x0) {
            free(local_520.data);
          }
        }
        else {
          (*(local_520.allocator)->_vptr_Allocator[3])(local_520.allocator,local_520.data);
        }
      }
    }
    local_520.data = (void *)0x0;
    local_520.elemsize = 0;
    local_520.elempack = 0;
    local_520.dims = 0;
    local_520.w = 0;
    local_520.h = 0;
    local_520.d = 0;
    local_520.c = 0;
    local_520.cstep = 0;
    local_520.refcount = (int *)0x0;
  }
  else if ((*(int *)(in_RSI + 5) == 4) && (*(int *)((long)in_RSI + 0x2c) == 1)) {
    Mat::reshape(local_168,(int)((ulong)local_168 >> 0x20),(int)local_168,
                 (int)((ulong)in_stack_fffffffffffffa78 >> 0x20),in_stack_fffffffffffffa70);
    local_158 = &local_568;
    local_150 = &local_3a8;
    if (&local_3a8 != local_158) {
      if (local_568.refcount != (int *)0x0) {
        local_15c = 1;
        LOCK();
        local_160 = *local_568.refcount;
        *local_568.refcount = *local_568.refcount + 1;
        UNLOCK();
      }
      local_138 = &local_3a8;
      if (local_3a8.refcount != (int *)0x0) {
        local_13c = 0xffffffff;
        LOCK();
        local_140 = *local_3a8.refcount;
        *local_3a8.refcount = *local_3a8.refcount + -1;
        UNLOCK();
        if (local_140 == 1) {
          if (local_3a8.allocator == (Allocator *)0x0) {
            local_130 = local_3a8.data;
            if (local_3a8.data != (void *)0x0) {
              free(local_3a8.data);
            }
          }
          else {
            (*(local_3a8.allocator)->_vptr_Allocator[3])(local_3a8.allocator,local_3a8.data);
          }
        }
      }
      local_3a8.data = (void *)0x0;
      local_3a8.elemsize = 0;
      local_3a8.elempack = 0;
      local_3a8.dims = 0;
      local_3a8.w = 0;
      local_3a8.h = 0;
      local_3a8.d = 0;
      local_3a8.c = 0;
      local_3a8.cstep = 0;
      local_3a8.refcount = (int *)0x0;
      local_3a8.data = local_158->data;
      local_3a8.refcount = local_158->refcount;
      local_3a8.elemsize = local_158->elemsize;
      local_3a8.elempack = local_158->elempack;
      local_3a8.allocator = local_158->allocator;
      local_3a8.dims = local_158->dims;
      local_3a8.w = local_158->w;
      local_3a8.h = local_158->h;
      local_3a8.d = local_158->d;
      local_3a8.c = local_158->c;
      local_3a8.cstep = local_158->cstep;
    }
    local_2e0 = &local_568;
    local_288 = local_2e0;
    local_148 = &local_3a8;
    if (local_568.refcount != (int *)0x0) {
      local_28c = 0xffffffff;
      LOCK();
      local_290 = *local_568.refcount;
      *local_568.refcount = *local_568.refcount + -1;
      UNLOCK();
      if (local_290 == 1) {
        if (local_568.allocator == (Allocator *)0x0) {
          if (local_568.data != (void *)0x0) {
            free(local_568.data);
          }
        }
        else {
          (*(local_568.allocator)->_vptr_Allocator[3])(local_568.allocator,local_568.data);
        }
      }
    }
    local_568.data = (void *)0x0;
    local_568.elemsize = 0;
    local_568.elempack = 0;
    local_568.dims = 0;
    local_568.w = 0;
    local_568.h = 0;
    local_568.d = 0;
    local_568.c = 0;
    local_568.cstep = 0;
    local_568.refcount = (int *)0x0;
  }
  if (local_354 == 0) {
    local_334 = binary_op_broadcast_inner<ncnn::BinaryOp_x86_avx_functor::binary_op_add>
                          (a,b,c,(Option *)CONCAT44(op_type,in_stack_00000330));
  }
  else if (local_354 == 1) {
    local_334 = binary_op_broadcast_inner<ncnn::BinaryOp_x86_avx_functor::binary_op_sub>
                          ((Mat *)b2._48_8_,(Mat *)b2._40_8_,(Mat *)b2.allocator,(Option *)b2._24_8_
                          );
  }
  else if (local_354 == 2) {
    local_334 = binary_op_broadcast_inner<ncnn::BinaryOp_x86_avx_functor::binary_op_mul>
                          ((Mat *)b2._48_8_,(Mat *)b2._40_8_,(Mat *)b2.allocator,(Option *)b2._24_8_
                          );
  }
  else if (local_354 == 3) {
    local_334 = binary_op_broadcast_inner<ncnn::BinaryOp_x86_avx_functor::binary_op_div>
                          ((Mat *)b2._48_8_,(Mat *)b2._40_8_,(Mat *)b2.allocator,(Option *)b2._24_8_
                          );
  }
  else if (local_354 == 4) {
    local_334 = binary_op_broadcast_inner<ncnn::BinaryOp_x86_avx_functor::binary_op_max>
                          ((Mat *)b2._48_8_,(Mat *)b2._40_8_,(Mat *)b2.allocator,(Option *)b2._24_8_
                          );
  }
  else if (local_354 == 5) {
    local_334 = binary_op_broadcast_inner<ncnn::BinaryOp_x86_avx_functor::binary_op_min>
                          ((Mat *)b2._48_8_,(Mat *)b2._40_8_,(Mat *)b2.allocator,(Option *)b2._24_8_
                          );
  }
  else if (local_354 == 6) {
    local_334 = binary_op_broadcast_inner<ncnn::BinaryOp_x86_avx_functor::binary_op_pow>
                          ((Mat *)b2._48_8_,(Mat *)b2._40_8_,(Mat *)b2.allocator,(Option *)b2._24_8_
                          );
  }
  else if (local_354 == 7) {
    local_334 = binary_op_broadcast_inner<ncnn::BinaryOp_x86_avx_functor::binary_op_rsub>
                          ((Mat *)b2._48_8_,(Mat *)b2._40_8_,(Mat *)b2.allocator,(Option *)b2._24_8_
                          );
  }
  else if (local_354 == 8) {
    local_334 = binary_op_broadcast_inner<ncnn::BinaryOp_x86_avx_functor::binary_op_rdiv>
                          ((Mat *)b2._48_8_,(Mat *)b2._40_8_,(Mat *)b2.allocator,(Option *)b2._24_8_
                          );
  }
  else if (local_354 == 9) {
    local_334 = binary_op_broadcast_inner<ncnn::BinaryOp_x86_avx_functor::binary_op_rpow>
                          ((Mat *)b2._48_8_,(Mat *)b2._40_8_,(Mat *)b2.allocator,(Option *)b2._24_8_
                          );
  }
  else if (local_354 == 10) {
    local_334 = binary_op_broadcast_inner<ncnn::BinaryOp_x86_avx_functor::binary_op_atan2>
                          ((Mat *)b2._48_8_,(Mat *)b2._40_8_,(Mat *)b2.allocator,(Option *)b2._24_8_
                          );
  }
  else if (local_354 == 0xb) {
    local_334 = binary_op_broadcast_inner<ncnn::BinaryOp_x86_avx_functor::binary_op_ratan2>
                          ((Mat *)b2._48_8_,(Mat *)b2._40_8_,(Mat *)b2.allocator,(Option *)b2._24_8_
                          );
  }
  else {
    local_334 = 0;
  }
  local_2d0 = &local_3a8;
  if (local_3a8.refcount != (int *)0x0) {
    local_2ac = 0xffffffff;
    LOCK();
    local_2b0 = *local_3a8.refcount;
    *local_3a8.refcount = *local_3a8.refcount + -1;
    UNLOCK();
    if (local_2b0 == 1) {
      local_2a8 = local_2d0;
      if (local_3a8.allocator == (Allocator *)0x0) {
        local_180 = local_3a8.data;
        if (local_3a8.data != (void *)0x0) {
          free(local_3a8.data);
        }
      }
      else {
        (*(local_3a8.allocator)->_vptr_Allocator[3])(local_3a8.allocator,local_3a8.data);
      }
    }
  }
  return local_334;
}

Assistant:

static int binary_op_broadcast_inner(const Mat& a, const Mat& b, Mat& c, int op_type, const Option& opt)
{
    // squeeze inner axes
    Mat b2 = b;
    if (b.dims == 2 && b.w == 1)
        b2 = b.reshape(b.h);
    else if (b.dims == 3 && b.h == 1)
        b2 = b.reshape(b.c);
    else if (b.dims == 3 && b.w == 1)
        b2 = b.reshape(b.h, b.c);
    else if (b.dims == 4 && b.d == 1)
        b2 = b.reshape(b.c);
    else if (b.dims == 4 && b.h == 1)
        b2 = b.reshape(b.d, b.c);
    else if (b.dims == 4 && b.w == 1)
        b2 = b.reshape(b.h, b.d, b.c);

    using namespace BinaryOp_x86_avx_functor;

    if (op_type == BinaryOp::Operation_ADD) return binary_op_broadcast_inner<binary_op_add>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_SUB) return binary_op_broadcast_inner<binary_op_sub>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_MUL) return binary_op_broadcast_inner<binary_op_mul>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_DIV) return binary_op_broadcast_inner<binary_op_div>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_MAX) return binary_op_broadcast_inner<binary_op_max>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_MIN) return binary_op_broadcast_inner<binary_op_min>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_POW) return binary_op_broadcast_inner<binary_op_pow>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_RSUB) return binary_op_broadcast_inner<binary_op_rsub>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_RDIV) return binary_op_broadcast_inner<binary_op_rdiv>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_RPOW) return binary_op_broadcast_inner<binary_op_rpow>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_ATAN2) return binary_op_broadcast_inner<binary_op_atan2>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_RATAN2) return binary_op_broadcast_inner<binary_op_ratan2>(a, b2, c, opt);

    // should never reach here
    return 0;
}